

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprites.cpp
# Opt level: O2

uint64_t anon_unknown.dwarf_6fdda9::expand_sprite_word(uint16_t source)

{
  ulong uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = ((ulong)CONCAT22(in_register_0000003a,source) * 0x1000001000 |
          (ulong)CONCAT22(in_register_0000003a,source) * 0x1000001) & 0xf000f000f000f;
  return uVar1 * 0x41 & 0x101010101010101 | uVar1 * 0x208 & 0x1010101010101010;
}

Assistant:

constexpr uint64_t expand_sprite_word(uint16_t source) {
	uint64_t result = source;
	result = (result | (result << 24)) & 0x0000'00ff'0000'00ff;
	result = (result | (result << 12)) & 0x000f'000f'000f'000f;
	result = (result | (result << 6)) & 0x0303'0303'0303'0303;
	result = (result | (result << 3)) & 0x1111'1111'1111'1111;
	return result;
}